

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tn93_shared.cc
# Opt level: O2

void dump_sequence_fasta(unsigned_long index,FILE *output,long firstSequenceLength,double *d,
                        bool is_prot,unsigned_long from,unsigned_long to)

{
  char *pcVar1;
  
  pcVar1 = stringText(&names,&nameLengths,index);
  if (d == (double *)0x0) {
    fprintf((FILE *)output,">%s\n",pcVar1);
  }
  else {
    fprintf((FILE *)output,">%s [%g, %g]\n",*d,d[1],pcVar1);
  }
  pcVar1 = stringText(&sequences,&seqLengths,index);
  dump_fasta(pcVar1,firstSequenceLength,output,true,is_prot,from,to);
  return;
}

Assistant:

void dump_sequence_fasta (unsigned long index, FILE* output, long firstSequenceLength, double * d, bool is_prot, unsigned long from, unsigned long to) {
  if (d) {
    fprintf (output, ">%s [%g, %g]\n", stringText (names, nameLengths, index), d[0], d[1]);
  } else {
    fprintf (output, ">%s\n", stringText (names, nameLengths, index));
  }
  
  dump_fasta (stringText (sequences, seqLengths, index), firstSequenceLength, output, true, is_prot, from, to);
}